

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<signed_char,_unsigned_long>::Run
          (DataTransform<signed_char,_unsigned_long> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  ulong uVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t *__idx;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar9;
  char input_data;
  ushort local_278;
  short local_276;
  short local_274;
  allocator local_271;
  istream *local_270;
  string *local_268;
  ulong local_260;
  ulong local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_268 = &this->print_format_;
  iVar7 = 0;
  local_270 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(local_270,(string *)&word);
      bVar8 = word._M_string_length == 0;
      if (!bVar8) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_278 = in_FPUControlWord | 0xc00;
        local_274 = (short)ROUND(in_ST0);
        input_data = (char)local_274;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar8) goto LAB_001134bd;
      if (bVar8) {
        if (bVar8) {
LAB_001136f0:
          bVar8 = true;
          if ((this->is_ascii_output_ == true) && (iVar7 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_00113712:
          bVar8 = false;
        }
        return bVar8;
      }
    }
    else {
      bVar8 = sptk::ReadStream<signed_char>(&input_data,local_270);
      if (!bVar8) goto LAB_001136f0;
LAB_001134bd:
      uVar4 = (ulong)input_data;
      uVar6 = this->minimum_value_;
      uVar3 = this->maximum_value_;
      if (uVar6 < uVar3) {
        NVar1 = this->input_numeric_type_;
        if (NVar1 == kFloatingPoint) {
          local_276 = (short)input_data;
          in_ST6 = in_ST5;
          local_258 = uVar6;
          if (((float)(long)uVar6 + *(float *)(&DAT_00140b30 + (ulong)((long)uVar6 < 0) * 4) <=
               (float)local_276) &&
             (uVar6 = uVar3, local_260 = uVar3,
             (float)local_276 <=
             (float)(long)uVar3 + *(float *)(&DAT_00140b30 + (ulong)((long)uVar3 < 0) * 4)))
          goto LAB_0011357f;
        }
        else if (NVar1 == kUnsignedInteger) {
          if (uVar6 <= uVar4) {
            bVar8 = uVar3 < uVar4;
            uVar6 = uVar3;
            if (!bVar8) {
              uVar6 = uVar4;
            }
            goto LAB_00113584;
          }
        }
        else {
          if (NVar1 != kSignedInteger) goto LAB_0011357f;
          if ((long)uVar6 <= (long)uVar4) {
            bVar8 = (long)uVar3 < (long)uVar4;
            uVar6 = uVar3;
            if ((long)uVar4 <= (long)uVar3) {
              uVar6 = uVar4;
            }
            goto LAB_00113584;
          }
        }
LAB_001135b1:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar7);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_271);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar2 == kExit) goto LAB_00113712;
        }
      }
      else {
LAB_0011357f:
        bVar8 = false;
        uVar6 = uVar4;
LAB_00113584:
        if ((bVar8) || (this->rounding_ == false)) {
          if (bVar8) goto LAB_001135b1;
        }
        else {
          if (input_data < '\x01') {
            dVar9 = (double)(int)input_data + -0.5;
          }
          else {
            dVar9 = (double)(int)input_data + 0.5;
          }
          uVar6 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar8 = sptk::SnPrintf<unsigned_long>(uVar6,local_268,0x80,buffer);
        if (!bVar8) goto LAB_00113712;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar7 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST7 = in_ST6;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar8 = sptk::WriteStream<unsigned_long>(uVar6,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar8) goto LAB_00113712;
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }